

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O3

void ht_del_hash_table(ht_hash_table *ht)

{
  ht_item *item;
  int iVar1;
  long lVar2;
  
  iVar1 = ht->size;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      item = ht->items[lVar2];
      if (item != (ht_item *)0x0 && item != &HT_DELETED_ITEM) {
        ht_del_item(item);
        iVar1 = ht->size;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  free(ht->items);
  free(ht);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"delete a hash table",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return;
}

Assistant:

void ht_del_hash_table(ht_hash_table* ht) {
    for (int i = 0; i < ht->size; i++) {
        ht_item* item = ht->items[i];
        if (item == &HT_DELETED_ITEM) {
            item = nullptr;
            // free(item);
        } else if (item != nullptr) {
            ht_del_item(item);
        }
    }
    free(ht->items);
    free(ht);
    std::cout << "delete a hash table" << std::endl;
}